

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O3

void * hashmap_get_with_hash(hashmap *map,void *key,uint64_t hash)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  
  sVar2 = map->bucketsz;
  uVar3 = map->mask;
  uVar5 = uVar3 & hash & 0xffffffffffff;
  pvVar4 = map->buckets;
  uVar6 = *(ulong *)((long)pvVar4 + sVar2 * uVar5);
  if (0xffffffffffff < uVar6) {
    pvVar7 = (void *)(sVar2 * uVar5 + (long)pvVar4);
    do {
      if ((uVar6 & 0xffffffffffff) == (hash & 0xffffffffffff)) {
        pvVar7 = (void *)((long)pvVar7 + 8);
        if (map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
          return pvVar7;
        }
        iVar1 = (*map->compare)(key,pvVar7,map->udata);
        if (iVar1 == 0) {
          return pvVar7;
        }
        sVar2 = map->bucketsz;
        uVar3 = map->mask;
        pvVar4 = map->buckets;
      }
      uVar5 = uVar5 + 1 & uVar3;
      pvVar7 = (void *)((long)pvVar4 + sVar2 * uVar5);
      uVar6 = *(ulong *)((long)pvVar4 + sVar2 * uVar5);
    } while (0xffffffffffff < uVar6);
  }
  return (void *)0x0;
}

Assistant:

const void *hashmap_get_with_hash(struct hashmap *map, const void *key, 
    uint64_t hash)
{
    hash = clip_hash(hash);
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) return NULL;
        if (bucket->hash == hash) {
            void *bitem = bucket_item(bucket);
            if (!map->compare || map->compare(key, bitem, map->udata) == 0) {
                return bitem;
            }
        }
        i = (i + 1) & map->mask;
    }
}